

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_q.cpp
# Opt level: O3

void consumer(int c_num)

{
  longlong lVar1;
  uint uVar2;
  bool bVar3;
  int temp;
  int local_3c;
  id local_38;
  
  local_38._M_thread = pthread_self();
  lVar1 = tid_to_ll(&local_38);
  if (1 < pr_level) {
    printf("[%-5s][%s:%d] [tid:%lld] %d elements should be consumed\n","info","consumer",0x2a,lVar1,
           c_num);
  }
  if (0 < c_num) {
    uVar2 = 1;
    do {
      buffer_queue<int>::pop(&g_q,&local_3c);
      if (1 < pr_level) {
        printf("[%-5s][%s:%d] ---[tid:%lld] consumed no.%d element\n","info","consumer",0x2f,lVar1,
               (ulong)uVar2);
      }
      LOCK();
      g_c_cnt.super___atomic_base<int>._M_i =
           (__atomic_base<int>)((int)g_c_cnt.super___atomic_base<int>._M_i + 1);
      UNLOCK();
      bVar3 = uVar2 != c_num;
      uVar2 = uVar2 + 1;
    } while (bVar3);
  }
  return;
}

Assistant:

void consumer(int c_num)
{
    long long tid = tid_to_ll(this_thread::get_id());
    PR_INFO("[tid:%lld] %d elements should be consumed\n", tid, c_num);
    int temp;
    for(int i=0; i<c_num; i++)
    {
        g_q.pop(temp);
        PR_INFO("---[tid:%lld] consumed no.%d element\n", tid, i+1);
        g_c_cnt.fetch_add(1);
    }
}